

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_constraint.cpp
# Opt level: O0

unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
duckdb::NotNullConstraint::Deserialize(Deserializer *deserializer)

{
  LogicalIndex in_RDI;
  unique_ptr<duckdb::NotNullConstraint,_std::default_delete<duckdb::NotNullConstraint>,_true> result
  ;
  LogicalIndex index;
  pointer in_stack_ffffffffffffffa8;
  _Head_base<0UL,_duckdb::Constraint_*,_false> _Var1;
  
  _Var1._M_head_impl = (Constraint *)in_RDI.index;
  Deserializer::ReadProperty<duckdb::LogicalIndex>
            ((Deserializer *)in_RDI.index,(field_id_t)(in_RDI.index >> 0x30),
             (char *)in_stack_ffffffffffffffa8);
  operator_new(0x18);
  NotNullConstraint(in_stack_ffffffffffffffa8,in_RDI);
  unique_ptr<duckdb::NotNullConstraint,std::default_delete<duckdb::NotNullConstraint>,true>::
  unique_ptr<std::default_delete<duckdb::NotNullConstraint>,void>
            ((unique_ptr<duckdb::NotNullConstraint,_std::default_delete<duckdb::NotNullConstraint>,_true>
              *)in_RDI.index,in_stack_ffffffffffffffa8);
  unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>::
  unique_ptr<duckdb::NotNullConstraint,std::default_delete<std::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>>>,void>
            ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
             in_RDI.index,
             (unique_ptr<duckdb::NotNullConstraint,_std::default_delete<duckdb::NotNullConstraint>_>
              *)in_stack_ffffffffffffffa8);
  unique_ptr<duckdb::NotNullConstraint,_std::default_delete<duckdb::NotNullConstraint>,_true>::
  ~unique_ptr((unique_ptr<duckdb::NotNullConstraint,_std::default_delete<duckdb::NotNullConstraint>,_true>
               *)0xacc289);
  return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
         (_Tuple_impl<0UL,_duckdb::Constraint_*,_std::default_delete<duckdb::Constraint>_>)
         _Var1._M_head_impl;
}

Assistant:

unique_ptr<Constraint> NotNullConstraint::Deserialize(Deserializer &deserializer) {
	auto index = deserializer.ReadProperty<LogicalIndex>(200, "index");
	auto result = duckdb::unique_ptr<NotNullConstraint>(new NotNullConstraint(index));
	return std::move(result);
}